

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
          (EditingIterator *this,ArenaAllocator *allocator)

{
  NodeBase *buffer;
  
  buffer = (this->super_Iterator).current;
  UnlinkCurrentNode(this);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x10);
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            const NodeBase *dead = this->current;
            UnlinkCurrent();

            auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();

            AllocatorFree(allocator, freeFunc, (Node *) dead, sizeof(Node));
        }